

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

CompressionRecord Imf_3_4::anon_unknown_1::retrieveCompressionRecord(Header *hdr)

{
  int iVar1;
  CompressionRecord in_RAX;
  pthread_mutex_t *__mutex;
  long lVar2;
  long lVar3;
  bool bVar4;
  CompressionRecord retval;
  CompressionRecord local_18;
  
  local_18 = in_RAX;
  exr_get_default_zip_compression_level(&local_18);
  exr_get_default_dwa_compression_quality(&local_18.dwa_level);
  __mutex = (pthread_mutex_t *)getStash();
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    lVar3 = *(long *)((long)__mutex + 0x38);
    if (lVar3 != 0) {
      lVar2 = (long)__mutex + 0x30;
      do {
        bVar4 = *(Header **)(lVar3 + 0x20) < hdr;
        if (!bVar4) {
          lVar2 = lVar3;
        }
        lVar3 = *(long *)(lVar3 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar3 != 0);
      if ((lVar2 != (long)__mutex + 0x30) && (*(Header **)(lVar2 + 0x20) <= hdr)) {
        local_18 = *(CompressionRecord *)(lVar2 + 0x28);
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return local_18;
}

Assistant:

static CompressionRecord
retrieveCompressionRecord (const Header* hdr)
{
    CompressionRecord retval;

    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (hdr);
        if (i != s->_store.end ()) retval = i->second;
    }
    return retval;
}